

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O0

EC_GROUP * EC_KEY_parse_curve_name(CBS *cbs)

{
  int iVar1;
  EC_GROUP *pEVar2;
  EC_GROUP *group;
  size_t i;
  CBS named_curve;
  CBS *cbs_local;
  
  named_curve.len = (size_t)cbs;
  iVar1 = CBS_get_asn1(cbs,(CBS *)&i,6);
  if (iVar1 == 0) {
    ERR_put_error(0xf,0,0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,0x12d);
  }
  else {
    for (group = (EC_GROUP *)0x0; group < (EC_GROUP *)0x4;
        group = (EC_GROUP *)((long)&group->meth + 1)) {
      pEVar2 = (*kAllGroups[(long)group])();
      iVar1 = CBS_mem_equal((CBS *)&i,pEVar2->oid,(ulong)pEVar2->oid_len);
      if (iVar1 != 0) {
        return pEVar2;
      }
    }
    ERR_put_error(0xf,0,0x7b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,0x139);
  }
  return (EC_GROUP *)0x0;
}

Assistant:

EC_GROUP *EC_KEY_parse_curve_name(CBS *cbs) {
  CBS named_curve;
  if (!CBS_get_asn1(cbs, &named_curve, CBS_ASN1_OBJECT)) {
    OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
    return NULL;
  }

  // Look for a matching curve.
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kAllGroups); i++) {
    const EC_GROUP *group = kAllGroups[i]();
    if (CBS_mem_equal(&named_curve, group->oid, group->oid_len)) {
      return (EC_GROUP *)group;
    }
  }

  OPENSSL_PUT_ERROR(EC, EC_R_UNKNOWN_GROUP);
  return NULL;
}